

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_check_sub_module(lys_module *module,unres_schema *unres,lys_node *node)

{
  lys_ext_instance ***ext;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  lys_revision *plVar5;
  lys_ext *plVar6;
  lys_feature *plVar7;
  lys_type *plVar8;
  undefined8 uVar9;
  lys_ext_instance **pplVar10;
  lys_tpdf *plVar11;
  lys_restr *plVar12;
  lys_node *plVar13;
  unres_schema *puVar14;
  int iVar15;
  lys_module *plVar16;
  lys_node *plVar17;
  lys_module *plVar18;
  lys_node *plVar19;
  LY_ERR *pLVar20;
  uint8_t uVar21;
  uint uVar22;
  char *pcVar23;
  ulong uVar24;
  LY_ECODE code;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  uint index;
  ulong uVar29;
  lys_deviation *plVar30;
  unres_schema local_a8;
  lys_type *local_78;
  ulong local_70;
  lys_module *local_68;
  ulong local_60;
  lys_node *local_58;
  lys_node *dev_target;
  lys_deviation *local_48;
  unres_schema *local_40;
  lys_node *local_38;
  
  bVar1 = module->augment_size;
  uVar25 = (ulong)bVar1;
  bVar2 = module->deviation_size;
  uVar27 = (ulong)bVar2;
  module->augment_size = '\0';
  module->deviation_size = '\0';
  local_40 = unres;
  local_38 = node;
  iVar15 = yang_check_typedef(module,(lys_node *)0x0,unres);
  if ((iVar15 == 0) &&
     (iVar15 = yang_check_ext_instance(module,&module->ext,(uint)module->ext_size,module,local_40),
     iVar15 == 0)) {
    if (module->rev_size != '\0') {
      lVar26 = 0x10;
      uVar29 = 0;
      do {
        plVar5 = module->rev;
        iVar15 = yang_check_ext_instance
                           (module,(lys_ext_instance ***)(plVar5->date + lVar26),
                            (uint)(byte)plVar5->date[lVar26 + -5],plVar5->date + lVar26 + -0x10,
                            local_40);
        if (iVar15 != 0) goto LAB_0014fd94;
        uVar29 = uVar29 + 1;
        lVar26 = lVar26 + 0x28;
      } while (uVar29 < module->rev_size);
    }
    if (module->extensions_size != '\0') {
      lVar26 = 0x20;
      uVar29 = 0;
      do {
        plVar6 = module->extensions;
        iVar15 = yang_check_ext_instance
                           (module,(lys_ext_instance ***)(plVar6->padding + lVar26 + -0x1b),
                            (uint)plVar6->padding[lVar26 + -0x21],plVar6->padding + lVar26 + -0x3b,
                            local_40);
        if (iVar15 != 0) goto LAB_0014fd94;
        uVar29 = uVar29 + 1;
        lVar26 = lVar26 + 0x40;
      } while (uVar29 < module->extensions_size);
    }
    if (module->features_size != '\0') {
      lVar26 = 0;
      uVar29 = 0;
      do {
        iVar15 = yang_check_iffeatures
                           (module,(void *)0x0,module->features->padding + lVar26 + -0x1c,
                            FEATURE_KEYWORD,local_40);
        if (iVar15 != 0) goto LAB_0014fd94;
        plVar7 = module->features;
        iVar15 = yang_check_ext_instance
                           (module,(lys_ext_instance ***)(plVar7->padding + lVar26 + 4),
                            (uint)plVar7->padding[lVar26 + -2],plVar7->padding + lVar26 + -0x1c,
                            local_40);
        if ((iVar15 != 0) ||
           ((module->features->padding[lVar26 + -1] != '\0' &&
            (iVar15 = unres_schema_add_node
                                (module,local_40,module->features->padding + lVar26 + -0x1c,
                                 UNRES_FEATURE,(lys_node *)0x0), iVar15 == -1)))) goto LAB_0014fd94;
        uVar29 = uVar29 + 1;
        lVar26 = lVar26 + 0x40;
      } while (uVar29 < module->features_size);
    }
    puVar14 = local_40;
    iVar15 = yang_check_identities(module,local_40);
    if (iVar15 == 0) {
      iVar15 = yang_check_nodes(module,(lys_node *)0x0,local_38,0,puVar14);
      if (iVar15 == 0) {
        if (uVar27 != 0) {
          uVar29 = 0;
          do {
            module->deviation_size = module->deviation_size + '\x01';
            plVar30 = module->deviation;
            local_48 = plVar30 + uVar29;
            local_58 = (lys_node *)0x0;
            local_70 = uVar29;
            dev_target = (lys_node *)ly_set_new();
            iVar15 = resolve_augment_schema_nodeid
                               (plVar30[uVar29].target_name,(lys_node *)0x0,module,1,&local_58);
            if ((iVar15 != 0) || (local_58 == (lys_node *)0x0)) {
              pcVar23 = local_48->target_name;
              plVar18 = (lys_module *)0x19c3d2;
              code = LYE_INARG;
LAB_00150517:
              ly_vlog(code,LY_VLOG_NONE,(void *)0x0,pcVar23,plVar18);
              plVar19 = dev_target;
LAB_00150609:
              ly_set_free((ly_set *)plVar19);
              goto LAB_0014fdaf;
            }
            plVar18 = local_58->module;
            plVar16 = lys_main_module(module);
            plVar19 = dev_target;
            if (plVar18 == plVar16) {
              ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,local_48->target_name,"deviation");
              ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Deviating own module is not allowed.");
              plVar19 = dev_target;
              goto LAB_00150609;
            }
            if (dev_target == (lys_node *)0x0) {
              pLVar20 = ly_errno_location();
              *pLVar20 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_deviation");
              plVar19 = (lys_node *)0x0;
              goto LAB_00150609;
            }
            if (local_48->deviate->mod == LY_DEVIATE_NO) {
              if ((((local_58->nodetype == LYS_LEAF) &&
                   (plVar17 = local_58->parent, plVar17 != (lys_node *)0x0)) &&
                  (plVar17->nodetype == LYS_LIST)) && ((ulong)plVar17->padding[2] != 0)) {
                uVar29 = 0;
                do {
                  if (*(lys_node **)(*(long *)&plVar17[1].flags + uVar29 * 8) == local_58) {
                    ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,"not-supported","deviation");
                    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                            "\"not-supported\" deviation cannot remove a list key.");
                    goto LAB_00150609;
                  }
                  uVar29 = uVar29 + 1;
                } while (plVar17->padding[2] != uVar29);
              }
              lys_node_unlink(local_58);
              local_48->orig_node = local_58;
            }
            else {
              local_a8.str_snode = (void **)0x0;
              local_a8.module = (lys_module **)0x0;
              local_a8.item = (void **)0x0;
              local_a8.type = (UNRES_ITEM *)0x0;
              local_a8.count = 0;
              local_a8._36_4_ = 0;
              plVar17 = lys_node_dup(local_58->module,(lys_node *)0x0,local_58,&local_a8,1);
              local_48->orig_node = plVar17;
              if (local_a8.count != 0) {
                pLVar20 = ly_errno_location();
                *pLVar20 = LY_EINT;
                ly_log(LY_LLERR,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
                       ,0x1160);
                goto LAB_00150609;
              }
            }
            plVar30 = local_48;
            iVar15 = yang_check_ext_instance
                               (module,&local_48->ext,(uint)local_48->ext_size,local_48,local_40);
            if (iVar15 != 0) goto LAB_00150609;
            if (plVar30->deviate_size != '\0') {
              uVar29 = 0;
              do {
                plVar17 = local_58;
                plVar19 = (lys_node *)(plVar30->deviate + uVar29);
                ext = &plVar30->deviate[uVar29].ext;
                local_60 = uVar29;
                iVar15 = yang_check_ext_instance
                                   (module,ext,(uint)*(uint8_t *)((long)ext + -0x3a),plVar19,
                                    local_40);
                if (((iVar15 != 0) ||
                    ((local_38 = plVar19, *(uint8_t *)((long)&plVar19->dsc + 1) != '\0' &&
                     (iVar15 = yang_check_deviate_must
                                         (module,local_40,(lys_deviate *)plVar19,plVar17),
                     plVar19 = local_38, iVar15 != 0)))) ||
                   ((local_38->ext != (lys_ext_instance **)0x0 &&
                    (iVar15 = yang_check_deviate_unique(module,(lys_deviate *)local_38,plVar17),
                    plVar19 = local_38, iVar15 != 0)))) {
LAB_001505cf:
                  if ((lys_type *)plVar19->iffeature != (lys_type *)0x0) {
                    yang_type_free(module->ctx,(lys_type *)plVar19->iffeature);
                    plVar19->iffeature = (lys_iffeature *)0x0;
                  }
                  plVar30 = local_48;
                  index = (int)local_60 + 1;
                  yang_free_deviate(module->ctx,local_48,index);
                  plVar30->deviate_size = (uint8_t)index;
                  plVar19 = dev_target;
                  goto LAB_00150609;
                }
                if (*(char *)((long)&local_38->name + 5) != '\0') {
                  iVar15 = yang_read_deviate_default
                                     (module,(lys_deviate *)local_38,plVar17,(ly_set *)dev_target);
                  plVar19 = local_38;
                  if (iVar15 != 0) goto LAB_001505cf;
                  if ((plVar17->nodetype == LYS_LEAFLIST) &&
                     (*(LYS_DEVIATE_TYPE *)&local_38->name == LY_DEVIATE_DEL)) {
                    bVar3 = plVar17->padding[2];
                    if ((ulong)bVar3 == 0) {
                      uVar21 = '\x01';
                    }
                    else {
                      plVar19 = plVar17[1].prev;
                      uVar24 = 0;
                      uVar29 = 0;
                      do {
                        *(undefined8 *)(plVar19->padding + uVar29 * 8 + -0x1c) =
                             *(undefined8 *)(plVar19->padding + uVar24 * 8 + -0x1c);
                        plVar19 = plVar17[1].prev;
                        uVar22 = ((int)uVar29 + 1) -
                                 (uint)(*(long *)(plVar19->padding + uVar29 * 8 + -0x1c) == 0);
                        uVar29 = (ulong)uVar22;
                        uVar24 = uVar24 + 1;
                      } while (bVar3 != uVar24);
                      uVar21 = (char)uVar22 + '\x01';
                    }
                    plVar17->padding[2] = uVar21;
                  }
                }
                if ((((*(char *)&local_38->dsc != '\0') &&
                     (iVar15 = yang_read_deviate_minmax
                                         ((lys_deviate *)local_38,plVar17,
                                          *(uint32_t *)&local_38->ref,1), plVar19 = local_38,
                     iVar15 != 0)) ||
                    ((*(char *)((long)&local_38->name + 7) != '\0' &&
                     (iVar15 = yang_read_deviate_minmax
                                         ((lys_deviate *)local_38,plVar17,
                                          *(uint32_t *)((long)&local_38->dsc + 4),0),
                     plVar19 = local_38, iVar15 != 0)))) ||
                   ((local_38->module != (lys_module *)0x0 &&
                    (iVar15 = yang_read_deviate_units(module->ctx,(lys_deviate *)local_38,plVar17),
                    plVar19 = local_38, iVar15 != 0)))) goto LAB_001505cf;
                bVar3 = *(byte *)((long)&local_38->name + 4);
                if ((bVar3 & 3) != 0) {
                  uVar4 = plVar17->flags;
                  plVar17->flags = bVar3 & 3 | uVar4 & 0xfffc;
                }
                if ((0x3f < bVar3) &&
                   (iVar15 = yang_check_deviate_mandatory((lys_deviate *)local_38,plVar17),
                   plVar19 = local_38, iVar15 != 0)) goto LAB_001505cf;
                if ((lys_type *)local_38->iffeature != (lys_type *)0x0) {
                  if ((plVar17->nodetype == LYS_LEAF) || (plVar17->nodetype == LYS_LEAFLIST)) {
                    local_78 = (lys_type *)&plVar17[1].ref;
                    local_68 = plVar17[1].module;
                    lys_type_free(module->ctx,local_78);
                    plVar19 = local_38;
                    plVar8 = (lys_type *)local_38->iffeature;
                    pcVar23 = plVar8->module_name;
                    uVar9._0_4_ = plVar8->base;
                    uVar9._4_1_ = plVar8->ext_size;
                    uVar9._5_3_ = *(undefined3 *)&plVar8->field_0xd;
                    pplVar10 = plVar8->ext;
                    plVar11 = plVar8->der;
                    plVar18 = (lys_module *)plVar8->parent;
                    plVar12 = (plVar8->info).binary.length;
                    plVar13 = (lys_node *)(plVar8->info).dec64.div;
                    plVar17[1].parent = (lys_node *)(plVar8->info).lref.target;
                    plVar17[1].child = plVar13;
                    plVar17[1].module = plVar18;
                    *(lys_restr **)&plVar17[1].nodetype = plVar12;
                    plVar17[1].ext = pplVar10;
                    plVar17[1].iffeature = (lys_iffeature *)plVar11;
                    plVar17[1].ref = pcVar23;
                    plVar17[1].flags = (short)(undefined4)uVar9;
                    plVar17[1].ext_size = (char)((ulong)uVar9 >> 0x10);
                    plVar17[1].iffeature_size = (char)((ulong)uVar9 >> 0x18);
                    plVar17[1].padding[0] = (char)((ulong)uVar9 >> 0x20);
                    plVar17[1].padding[1] = (char)((ulong)uVar9 >> 0x28);
                    plVar17[1].padding[2] = (char)((ulong)uVar9 >> 0x30);
                    plVar17[1].padding[3] = (char)((ulong)uVar9 >> 0x38);
                    free((lys_type *)local_38->iffeature);
                    plVar19->iffeature = (lys_iffeature *)local_78;
                    plVar17[1].module = local_68;
                    iVar15 = yang_fill_type(module,local_78,(yang_type *)plVar17[1].iffeature,
                                            local_68,local_40);
                    if ((iVar15 == 0) &&
                       (iVar15 = unres_schema_add_node
                                           (module,local_40,(lys_type *)plVar19->iffeature,
                                            UNRES_TYPE_DER,plVar17), plVar19 = local_38,
                       iVar15 != -1)) goto LAB_0015033b;
                  }
                  else {
                    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"type");
                    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                            "Target node does not allow \"type\" property.");
                    plVar19 = local_38;
                  }
                  goto LAB_001505cf;
                }
LAB_0015033b:
                uVar29 = local_60 + 1;
                plVar30 = local_48;
              } while (uVar29 < local_48->deviate_size);
            }
            if (*(int *)((long)&dev_target->name + 4) != 0) {
              uVar29 = 0;
              do {
                plVar30 = *(lys_deviation **)(dev_target->dsc + uVar29 * 8);
                local_68 = (lys_module *)plVar30->target_name;
                local_60 = uVar29;
                if (*(int *)&plVar30[1].target_name == 4) {
                  plVar19 = plVar30[3].orig_node;
                  iVar15 = unres_schema_add_node
                                     (module,local_40,&plVar30[2].dsc,UNRES_TYPE_DFLT,
                                      (lys_node *)&plVar30[3].orig_node);
                  if (iVar15 == -1) {
LAB_001504e9:
                    ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,plVar19,"default");
                    pcVar23 = 
                    "The default value \"%s\" of the deviated node \"%s\"no longer matches its type."
                    ;
                    code = LYE_SPEC;
                    plVar18 = local_68;
                    goto LAB_00150517;
                  }
                }
                else if (*(char *)((long)&plVar30->orig_node + 6) != '\0') {
                  local_38 = (lys_node *)&plVar30[2].dsc;
                  lVar26 = 0;
                  uVar29 = 0;
                  local_48 = plVar30;
                  do {
                    iVar15 = unres_schema_add_node
                                       (module,local_40,local_38,UNRES_TYPE_DFLT,
                                        (lys_node *)
                                        ((local_48[3].orig_node)->padding + lVar26 + -0x1c));
                    if (iVar15 == -1) {
                      plVar19 = *(lys_node **)((local_48[3].orig_node)->padding + lVar26 + -0x1c);
                      goto LAB_001504e9;
                    }
                    uVar29 = uVar29 + 1;
                    lVar26 = lVar26 + 8;
                  } while (uVar29 < *(byte *)((long)&local_48->orig_node + 6));
                }
                uVar29 = local_60 + 1;
              } while (uVar29 < *(uint *)((long)&dev_target->name + 4));
            }
            ly_set_free((ly_set *)dev_target);
            for (plVar19 = local_58; plVar19 != (lys_node *)0x0; plVar19 = lys_parent(plVar19)) {
              plVar18 = lys_node_module(plVar19);
              if (plVar18 != module) {
                plVar18->field_0x40 = plVar18->field_0x40 & 0xcf | 0x10;
                lys_set_implemented(plVar18);
              }
            }
            uVar29 = local_70 + 1;
          } while (uVar29 != uVar27);
        }
        if (uVar25 == 0) {
          return 0;
        }
        local_38 = (lys_node *)(uVar25 * 0x68);
        plVar19 = (lys_node *)0x0;
        while( true ) {
          puVar14 = local_40;
          module->augment_size = module->augment_size + '\x01';
          iVar15 = yang_check_augment(module,(lys_node_augment *)
                                             (plVar19->padding +
                                             (long)(module->augment->padding + -0x38)),0,local_40);
          if ((iVar15 != 0) ||
             (iVar15 = unres_schema_add_node
                                 (module,puVar14,
                                  plVar19->padding + (long)(module->augment->padding + -0x38),
                                  UNRES_AUGMENT,(lys_node *)0x0), iVar15 == -1)) break;
          plVar19 = plVar19 + 1;
          if (local_38 == plVar19) {
            return 0;
          }
        }
      }
      goto LAB_0014fdaf;
    }
  }
  else {
LAB_0014fd94:
    yang_free_ident_base(module->ident,0,(uint)module->ident_size);
  }
  yang_free_nodes(module->ctx,local_38);
LAB_0014fdaf:
  bVar3 = module->augment_size;
  if (bVar3 < bVar1) {
    lVar28 = (ulong)bVar3 * 0x68;
    lVar26 = uVar25 - bVar3;
    do {
      yang_free_augment(module->ctx,(lys_node_augment *)(module->augment->padding + lVar28 + -0x1c))
      ;
      lVar28 = lVar28 + 0x68;
      lVar26 = lVar26 + -1;
    } while (lVar26 != 0);
  }
  bVar1 = module->deviation_size;
  if (bVar1 < bVar2) {
    lVar28 = (ulong)bVar1 * 0x38;
    lVar26 = uVar27 - bVar1;
    do {
      yang_free_deviate(module->ctx,
                        (lys_deviation *)((long)&module->deviation->target_name + lVar28),0);
      free(*(void **)((long)&module->deviation->deviate + lVar28));
      lVar28 = lVar28 + 0x38;
      lVar26 = lVar26 + -1;
    } while (lVar26 != 0);
  }
  return 1;
}

Assistant:

static int
yang_check_sub_module(struct lys_module *module, struct unres_schema *unres, struct lys_node *node)
{
    uint i, erase_identities = 1, erase_nodes = 1, aug_size, dev_size = 0;

    aug_size = module->augment_size;
    module->augment_size = 0;
    dev_size = module->deviation_size;
    module->deviation_size = 0;

    if (yang_check_typedef(module, NULL, unres)) {
        goto error;
    }

    if (yang_check_ext_instance(module, &module->ext, module->ext_size, module, unres)) {
        goto error;
    }

    /* check extension in revision */
    for (i = 0; i < module->rev_size; ++i) {
        if (yang_check_ext_instance(module, &module->rev[i].ext, module->rev[i].ext_size, &module->rev[i], unres)) {
            goto error;
        }
    }

    /* check extension in definition of extension */
    for (i = 0; i < module->extensions_size; ++i) {
        if (yang_check_ext_instance(module, &module->extensions[i].ext, module->extensions[i].ext_size, &module->extensions[i], unres)) {
            goto error;
        }
    }

    /* check features */
    for (i = 0; i < module->features_size; ++i) {
        if (yang_check_iffeatures(module, NULL, &module->features[i], FEATURE_KEYWORD, unres)) {
            goto error;
        }
        if (yang_check_ext_instance(module, &module->features[i].ext, module->features[i].ext_size, &module->features[i], unres)) {
            goto error;
        }

        /* check for circular dependencies */
        if (module->features[i].iffeature_size && (unres_schema_add_node(module, unres, &module->features[i], UNRES_FEATURE, NULL) == -1)) {
            goto error;
        }
    }
    erase_identities = 0;
    if (yang_check_identities(module, unres)) {
        goto error;
    }
    erase_nodes = 0;
    if (yang_check_nodes(module, NULL, node, 0, unres)) {
        goto error;
    }

    /* check deviation */
    for (i = 0; i < dev_size; ++i) {
        module->deviation_size++;
        if (yang_check_deviation(module, unres, &module->deviation[i])) {
            goto error;
        }
    }

    /* check augments */
    for (i = 0; i < aug_size; ++i) {
        module->augment_size++;
        if (yang_check_augment(module, &module->augment[i], 0, unres)) {
            goto error;
        }
        if (unres_schema_add_node(module, unres, &module->augment[i], UNRES_AUGMENT, NULL) == -1) {
            goto error;
        }
    }

    return EXIT_SUCCESS;
error:
    if (erase_identities) {
        yang_free_ident_base(module->ident, 0, module->ident_size);
    }
    if (erase_nodes) {
        yang_free_nodes(module->ctx, node);
    }
    for (i = module->augment_size; i < aug_size; ++i) {
        yang_free_augment(module->ctx, &module->augment[i]);
    }
    for (i = module->deviation_size; i < dev_size; ++i) {
        yang_free_deviate(module->ctx, &module->deviation[i], 0);
        free(module->deviation[i].deviate);
    }
    return EXIT_FAILURE;
}